

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>
fmt::v5::internal::
format_decimal<wchar_t,unsigned_long,std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,fmt::v5::internal::add_thousands_sep<wchar_t>>
          (back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> out,
          unsigned_long value,int num_digits,add_thousands_sep<wchar_t> sep)

{
  add_thousands_sep<wchar_t> thousands_sep;
  type tVar1;
  wchar_t *in_stack_00000008;
  wchar_t *in_stack_00000010;
  back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> in_stack_00000018;
  wchar_t *end;
  char_type buffer [26];
  unsigned_long in_stack_ffffffffffffff50;
  wchar_t *in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff78 [16];
  
  thousands_sep._8_16_ = in_stack_ffffffffffffff78;
  thousands_sep.sep_.data_ = in_stack_ffffffffffffff70;
  format_decimal<unsigned_long,wchar_t,fmt::v5::internal::add_thousands_sep<wchar_t>>
            (in_stack_00000008,in_stack_ffffffffffffff50,
             (int)((ulong)in_stack_00000018.container >> 0x20),thousands_sep);
  tVar1 = copy_str<wchar_t,wchar_t*,std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>>
                    (in_stack_00000010,in_stack_00000008,in_stack_00000018);
  return (back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>)tVar1.container;
}

Assistant:

inline Iterator format_decimal(
    Iterator out, UInt value, int num_digits, ThousandsSep sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  typedef typename ThousandsSep::char_type char_type;
  // Buffer should be large enough to hold all digits (<= digits10 + 1).
  enum { max_size = std::numeric_limits<UInt>::digits10 + 1 };
  FMT_ASSERT(ThousandsSep::size <= 1, "invalid separator");
  char_type buffer[max_size + max_size / 3];
  auto end = format_decimal(buffer, value, num_digits, sep);
  return internal::copy_str<OutChar>(buffer, end, out);
}